

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecMult.c
# Opt level: O3

Vec_Int_t * Acec_MultCollectInputs(Vec_Int_t *vPairs,Vec_Int_t *vRanks,int iObj)

{
  ulong uVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  Vec_Int_t *p;
  int *piVar5;
  int iVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  
  p = (Vec_Int_t *)malloc(0x10);
  p->nCap = 100;
  p->nSize = 0;
  piVar5 = (int *)malloc(400);
  p->pArray = piVar5;
  if (1 < vPairs->nSize) {
    lVar12 = 0;
    do {
      iVar2 = vPairs->pArray[lVar12];
      iVar6 = vPairs->pArray[lVar12 + 1];
      if (iVar2 == iObj) {
        if (0 < (long)p->nSize) {
          lVar7 = 0;
          do {
            if (p->pArray[lVar7] == iVar6) goto LAB_00678a3e;
            lVar7 = lVar7 + 1;
          } while (p->nSize != lVar7);
        }
LAB_00678a36:
        Vec_IntPush(p,iVar6);
      }
      else if (iVar6 == iObj) {
        iVar6 = iVar2;
        if (0 < (long)p->nSize) {
          lVar7 = 0;
          do {
            if (p->pArray[lVar7] == iVar2) goto LAB_00678a3e;
            lVar7 = lVar7 + 1;
          } while (p->nSize != lVar7);
        }
        goto LAB_00678a36;
      }
LAB_00678a3e:
      lVar12 = lVar12 + 2;
    } while ((int)((uint)lVar12 | 1) < vPairs->nSize);
    iVar2 = p->nSize;
    if (1 < (long)iVar2) {
      piVar5 = p->pArray;
      uVar8 = 1;
      uVar9 = 0;
      do {
        uVar1 = uVar9 + 1;
        uVar11 = uVar9 & 0xffffffff;
        uVar10 = uVar8;
        do {
          iVar6 = piVar5[uVar10];
          if (((long)iVar6 < 0) || (vRanks->nSize <= iVar6)) {
LAB_00678adb:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          uVar3 = piVar5[(int)uVar11];
          if (((long)(int)uVar3 < 0) || ((uint)vRanks->nSize <= uVar3)) goto LAB_00678adb;
          uVar4 = uVar10 & 0xffffffff;
          if (vRanks->pArray[(int)uVar3] <= vRanks->pArray[iVar6]) {
            uVar4 = uVar11;
          }
          uVar11 = uVar4;
          uVar10 = uVar10 + 1;
        } while ((long)iVar2 != uVar10);
        iVar6 = piVar5[uVar9];
        piVar5[uVar9] = piVar5[(int)uVar11];
        piVar5[(int)uVar11] = iVar6;
        uVar8 = uVar8 + 1;
        uVar9 = uVar1;
      } while (uVar1 != iVar2 - 1);
    }
  }
  return p;
}

Assistant:

Vec_Int_t * Acec_MultCollectInputs( Vec_Int_t * vPairs, Vec_Int_t * vRanks, int iObj )
{
    Vec_Int_t * vItems = Vec_IntAlloc( 100 );
    int k, iObj1, iObj2;
    // collect all those appearing with this one
    Vec_IntForEachEntryDouble( vPairs, iObj1, iObj2, k )
        if ( iObj == iObj1 )
            Vec_IntPushUnique( vItems, iObj2 );
        else if ( iObj == iObj2 )
            Vec_IntPushUnique( vItems, iObj1 );
    // sort items by rank cost
    Vec_IntSelectSortCost( Vec_IntArray(vItems), Vec_IntSize(vItems), vRanks );
    return vItems;
}